

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O3

void __thiscall TasGrid::GridFourier::write<false>(GridFourier *this,ostream *os)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)os;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 0x11;
  IO::writeNumbers<false,(TasGrid::IO::IOPad)3,int,int>
            (os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  MultiIndexSet::write<false>(&this->tensors,os);
  MultiIndexSet::write<false>(&this->active_tensors,os);
  if ((this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->active_w,os);
  }
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>
            ((this->super_BaseCanonicalGrid).points.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             != (this->super_BaseCanonicalGrid).points.indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,os);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<false>(&(this->super_BaseCanonicalGrid).points,os);
  }
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>
            ((this->super_BaseCanonicalGrid).needed.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             != (this->super_BaseCanonicalGrid).needed.indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,os);
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<false>(&(this->super_BaseCanonicalGrid).needed,os);
  }
  IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->max_levels,os);
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<false>(&(this->super_BaseCanonicalGrid).values,os);
    IO::writeFlag<false,(TasGrid::IO::IOPad)4>((int)(this->fourier_coefs).num_strips != 0,os);
    if ((this->fourier_coefs).num_strips != 0) {
      IO::writeVector<false,(TasGrid::IO::IOPad)3,double>(&(this->fourier_coefs).vec,os);
    }
  }
  IO::writeFlag<false,(TasGrid::IO::IOPad)3>
            ((this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,os);
  if ((this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<false>(&this->updated_tensors,os);
    MultiIndexSet::write<false>(&this->updated_active_tensors,os);
    IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->updated_active_w,os);
    return;
  }
  return;
}

Assistant:

void GridFourier::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_line>(os, num_dimensions, num_outputs);

    tensors.write<iomode>(os);
    active_tensors.write<iomode>(os);
    if (!active_w.empty())
        IO::writeVector<iomode, IO::pad_line>(active_w, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeVector<iomode, IO::pad_line>(max_levels, os);

    if (num_outputs > 0){
        values.write<iomode>(os);
        IO::writeFlag<iomode, IO::pad_auto>((fourier_coefs.getNumStrips() != 0), os);
        if (!fourier_coefs.empty()) fourier_coefs.writeVector<iomode, IO::pad_line>(os);
    }

    IO::writeFlag<iomode, IO::pad_line>(!updated_tensors.empty(), os);
    if (!updated_tensors.empty()){
        updated_tensors.write<iomode>(os);
        updated_active_tensors.write<iomode>(os);
        IO::writeVector<iomode, IO::pad_line>(updated_active_w, os);
    }
}